

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist.c
# Opt level: O2

PList * p_list_remove(PList *list,pconstpointer data)

{
  PList *pPVar1;
  PList *mem;
  PList *pPVar2;
  
  if (list == (PList *)0x0) {
    list = (PList *)0x0;
  }
  else {
    pPVar1 = (PList *)0x0;
    for (mem = list; mem != (PList *)0x0; mem = mem->next) {
      if (mem->data == data) {
        pPVar2 = mem->next;
        if (pPVar1 != (PList *)0x0) {
          pPVar1->next = pPVar2;
          pPVar2 = list;
        }
        p_free(mem);
        return pPVar2;
      }
      pPVar1 = mem;
    }
  }
  return list;
}

Assistant:

P_LIB_API PList *
p_list_remove (PList		*list,
	       pconstpointer	data)
{
	PList *cur;
	PList *prev;
	PList *head;

	if (P_UNLIKELY (list == NULL))
		return NULL;

	for (head = list, prev = NULL, cur = list; cur != NULL;  prev = cur, cur = cur->next) {
		if (cur->data == data) {
			if (prev == NULL)
				head = cur->next;
			else
				prev->next = cur->next;

			p_free (cur);

			break;
		}
	}

	return head;
}